

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_do(Curl_easy *data,_Bool *done)

{
  Curl_cwriter *local_40;
  Curl_cwriter *ftp_lc_writer;
  ftp_conn *ftpc;
  connectdata *conn;
  _Bool *p_Stack_20;
  CURLcode result;
  _Bool *done_local;
  Curl_easy *data_local;
  
  conn._4_4_ = 0;
  ftpc = (ftp_conn *)data->conn;
  ftp_lc_writer = (Curl_cwriter *)&((connectdata *)ftpc)->proto;
  *done = false;
  *(byte *)((long)&((connectdata *)ftpc)->proto + 0x112) =
       *(byte *)((long)&((connectdata *)ftpc)->proto + 0x112) & 0xdf;
  p_Stack_20 = done;
  done_local = (_Bool *)data;
  conn._4_4_ = Curl_cwriter_create(&local_40,data,&ftp_cw_lc,CURL_CW_CONTENT_DECODE);
  data_local._4_4_ = conn._4_4_;
  if (conn._4_4_ == CURLE_OK) {
    conn._4_4_ = Curl_cwriter_add((Curl_easy *)done_local,local_40);
    if (conn._4_4_ == CURLE_OK) {
      if ((*(uint *)(done_local + 0x13be) >> 8 & 1) == 0) {
        data_local._4_4_ = ftp_parse_url_path((Curl_easy *)done_local);
      }
      else {
        data_local._4_4_ = wc_statemach((Curl_easy *)done_local);
        if ((*(char *)(*(long *)(done_local + 0x13c8) + 0x40) == '\x05') ||
           (*(char *)(*(long *)(done_local + 0x13c8) + 0x40) == '\a')) {
          return CURLE_OK;
        }
      }
      if (data_local._4_4_ == CURLE_OK) {
        conn._4_4_ = 0;
        data_local._4_4_ = ftp_regular_transfer((Curl_easy *)done_local,p_Stack_20);
      }
    }
    else {
      Curl_cwriter_free((Curl_easy *)done_local,local_40);
      data_local._4_4_ = conn._4_4_;
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode ftp_do(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  *done = FALSE; /* default to false */
  ftpc->wait_data_conn = FALSE; /* default to no such wait */

#ifdef CURL_PREFER_LF_LINEENDS
  {
    /* FTP data may need conversion. */
    struct Curl_cwriter *ftp_lc_writer;

    result = Curl_cwriter_create(&ftp_lc_writer, data, &ftp_cw_lc,
                                 CURL_CW_CONTENT_DECODE);
    if(result)
      return result;

    result = Curl_cwriter_add(data, ftp_lc_writer);
    if(result) {
      Curl_cwriter_free(data, ftp_lc_writer);
      return result;
    }
  }
#endif /* CURL_PREFER_LF_LINEENDS */

  if(data->state.wildcardmatch) {
    result = wc_statemach(data);
    if(data->wildcard->state == CURLWC_SKIP ||
       data->wildcard->state == CURLWC_DONE) {
      /* do not call ftp_regular_transfer */
      return CURLE_OK;
    }
    if(result) /* error, loop or skipping the file */
      return result;
  }
  else { /* no wildcard FSM needed */
    result = ftp_parse_url_path(data);
    if(result)
      return result;
  }

  result = ftp_regular_transfer(data, done);

  return result;
}